

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fOpaqueTypeIndexingTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BlockArrayIndexingCase::iterate
          (BlockArrayIndexingCase *this)

{
  ostringstream *this_00;
  uint uVar1;
  BlockType BVar2;
  undefined4 uVar3;
  RenderContext *renderCtx;
  TestContext *this_01;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  uint uVar7;
  deUint32 dVar8;
  ContextType ctxType;
  int iVar9;
  GLenum GVar10;
  char *varPrefix;
  ostream *poVar11;
  long *plVar12;
  Functions *gl;
  undefined4 extraout_var_00;
  ObjectTraits *traits;
  ShaderExecutor *pSVar13;
  _func_int **pp_Var14;
  TestError *this_02;
  int readNdx_2;
  size_type *psVar15;
  int numVars;
  undefined1 auVar16 [8];
  int readNdx_1;
  size_type __n;
  char *pcVar17;
  long lVar18;
  int *indices;
  int readNdx;
  GLuint GVar19;
  long lVar20;
  size_type sVar21;
  char *pcVar22;
  int iVar23;
  uint *puVar24;
  uint *puVar25;
  string varName;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inValues;
  Random rnd;
  ShaderSpec shaderSpec;
  ostringstream s;
  ostringstream global;
  ostringstream code;
  string local_598;
  uint *local_570;
  VarType local_568;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_548;
  deRandom local_530;
  undefined1 local_520 [56];
  _Alloc_hider local_4e8;
  size_type local_4e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d8;
  _Alloc_hider local_4c8;
  size_type local_4c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8;
  undefined1 local_4a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_498;
  VarType local_488 [3];
  ios_base local_438 [8];
  ios_base local_430 [264];
  undefined1 local_328 [16];
  pointer local_318;
  ios_base local_2b8 [272];
  undefined1 local_1a8 [8];
  _func_int **pp_Stack_1a0;
  long local_198;
  ios_base local_138 [264];
  undefined4 extraout_var;
  
  uVar1 = this->m_numInstances;
  __n = (size_type)(int)uVar1;
  varPrefix = (char *)operator_new(0x10);
  varPrefix[0] = '\0';
  varPrefix[1] = '\0';
  varPrefix[2] = '\0';
  varPrefix[3] = '\0';
  varPrefix[4] = '\0';
  varPrefix[5] = '\0';
  varPrefix[6] = '\0';
  varPrefix[7] = '\0';
  varPrefix[8] = '\0';
  varPrefix[9] = '\0';
  varPrefix[10] = '\0';
  varPrefix[0xb] = '\0';
  varPrefix[0xc] = '\0';
  varPrefix[0xd] = '\0';
  varPrefix[0xe] = '\0';
  varPrefix[0xf] = '\0';
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_548,__n,(allocator_type *)local_4a8);
  local_570 = (uint *)operator_new(0x200);
  memset(local_570,0,0x200);
  local_4e8._M_p = (pointer)&local_4d8;
  local_520._0_4_ = GLSL_VERSION_300_ES;
  local_520._8_8_ = (pointer)0x0;
  local_520._16_8_ = (pointer)0x0;
  local_520._24_8_ = (pointer)0x0;
  local_520._32_8_ = (pointer)0x0;
  local_520._40_8_ = (pointer)0x0;
  local_520._48_8_ = (pointer)0x0;
  local_4e0 = 0;
  local_4d8._M_local_buf[0] = '\0';
  local_4c8._M_p = (pointer)&local_4b8;
  local_4c0 = 0;
  local_4b8._M_local_buf[0] = '\0';
  uVar7 = (this->m_shaderType >> 0x10 ^ this->m_shaderType ^ 0x3d) * 9;
  uVar4 = (this->m_blockType >> 0x10 ^ this->m_blockType ^ 0x3d) * 9;
  uVar5 = (this->m_indexExprType >> 0x10 ^ this->m_indexExprType ^ 0x3d) * 9;
  uVar7 = (uVar5 >> 4 ^ uVar5) * 0x27d4eb2d ^
          (uVar4 >> 4 ^ uVar4) * 0x27d4eb2d ^ (uVar7 >> 4 ^ uVar7) * 0x27d4eb2d;
  deRandom_init(&local_530,uVar7 >> 0xf ^ uVar7);
  lVar20 = 0;
  do {
    dVar8 = deRandom_getUint32(&local_530);
    *(uint *)(varPrefix + lVar20 * 4) = dVar8 % uVar1;
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  if (0 < (int)uVar1) {
    sVar21 = 0;
    do {
      dVar8 = deRandom_getUint32(&local_530);
      local_548.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[sVar21] = dVar8;
      sVar21 = sVar21 + 1;
    } while (__n != sVar21);
  }
  BVar2 = this->m_blockType;
  pcVar17 = "buffer";
  if (BVar2 == BLOCKTYPE_UNIFORM) {
    pcVar17 = "uniform";
  }
  pcVar22 = "std430";
  if (BVar2 == BLOCKTYPE_UNIFORM) {
    pcVar22 = "std140";
  }
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar6 = glu::contextSupports(ctxType,(ApiType)0x23);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  if (INDEX_EXPR_TYPE_CONST_EXPRESSION < this->m_indexExprType && !bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_328,"#extension GL_EXT_gpu_shader5 : require\n",0x28);
  }
  if (this->m_indexExprType == INDEX_EXPR_TYPE_CONST_EXPRESSION) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_328,"const highp int indexBase = 1;\n",0x1f);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,"layout(",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,pcVar22,6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,", binding = ",0xc);
  poVar11 = (ostream *)std::ostream::operator<<(local_328,2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,") ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,pcVar17,(ulong)(BVar2 == BLOCKTYPE_UNIFORM) + 6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"Block",5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n{\n\tuint value;\n} ",0x12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"block",5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"[",1);
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar1);
  pcVar17 = "];\n";
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"];\n",3);
  if (this->m_indexExprType == INDEX_EXPR_TYPE_UNIFORM) {
    declareUniformIndexVars((ostream *)local_328,pcVar17,numVars);
  }
  else if (this->m_indexExprType == INDEX_EXPR_TYPE_DYNAMIC_UNIFORM) {
    iVar23 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
      std::ostream::operator<<((Symbol *)local_4a8,iVar23);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
      std::ios_base::~ios_base(local_438);
      plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_568,0,(char *)0x0,0x1c20f9e);
      psVar15 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_598.field_2._M_allocated_capacity = *psVar15;
        local_598.field_2._8_8_ = plVar12[3];
        local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
      }
      else {
        local_598.field_2._M_allocated_capacity = *psVar15;
        local_598._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_598._M_string_length = plVar12[1];
      *plVar12 = (long)psVar15;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      if (local_568._0_8_ != (long)&local_568 + 0x10U) {
        operator_delete((void *)local_568._0_8_,local_568.m_data._8_8_ + 1);
      }
      glu::VarType::VarType(&local_568,TYPE_INT,PRECISION_HIGHP);
      deqp::gls::ShaderExecUtil::Symbol::Symbol((Symbol *)local_4a8,&local_598,&local_568);
      std::
      vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
      ::emplace_back<deqp::gls::ShaderExecUtil::Symbol>
                ((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                  *)(local_520 + 8),(Symbol *)local_4a8);
      glu::VarType::~VarType(local_488);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._0_8_ != &local_498) {
        operator_delete((void *)local_4a8._0_8_,local_498._M_allocated_capacity + 1);
      }
      glu::VarType::~VarType(&local_568);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_598._M_dataplus._M_p != &local_598.field_2) {
        operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
      }
      iVar23 = iVar23 + 1;
    } while (iVar23 != 4);
  }
  iVar23 = 0;
  do {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
    std::ostream::operator<<((Symbol *)local_4a8,iVar23);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
    std::ios_base::~ios_base(local_438);
    indices = (int *)0x6;
    plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_568,0,(char *)0x0,0x1a8bdb9);
    psVar15 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar15) {
      local_598.field_2._M_allocated_capacity = *psVar15;
      local_598.field_2._8_8_ = plVar12[3];
      local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
    }
    else {
      local_598.field_2._M_allocated_capacity = *psVar15;
      local_598._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_598._M_string_length = plVar12[1];
    *plVar12 = (long)psVar15;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    if (local_568._0_8_ != (long)&local_568 + 0x10U) {
      operator_delete((void *)local_568._0_8_,local_568.m_data._8_8_ + 1);
    }
    glu::VarType::VarType(&local_568,TYPE_UINT,PRECISION_HIGHP);
    deqp::gls::ShaderExecUtil::Symbol::Symbol((Symbol *)local_4a8,&local_598,&local_568);
    std::
    vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>::
    emplace_back<deqp::gls::ShaderExecUtil::Symbol>
              ((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                *)(local_520 + 0x20),(Symbol *)local_4a8);
    glu::VarType::~VarType(local_488);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._0_8_ != &local_498) {
      operator_delete((void *)local_4a8._0_8_,local_498._M_allocated_capacity + 1);
    }
    glu::VarType::~VarType(&local_568);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_598._M_dataplus._M_p != &local_598.field_2) {
      operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
    }
    iVar23 = iVar23 + 1;
  } while (iVar23 != 4);
  lVar20 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"result",6);
    iVar23 = (int)lVar20;
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar23);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," = ",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"block",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"[",1);
    if (this->m_indexExprType == INDEX_EXPR_TYPE_CONST_EXPRESSION) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"indexBase + ",0xc);
      iVar23 = *(int *)(varPrefix + lVar20 * 4) + -1;
    }
    else if (this->m_indexExprType == INDEX_EXPR_TYPE_CONST_LITERAL) {
      iVar23 = *(int *)(varPrefix + lVar20 * 4);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"index",5);
    }
    std::ostream::operator<<((ostream *)local_1a8,iVar23);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"].value;\n",9);
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  local_520._0_4_ = bVar6 | GLSL_VERSION_310_ES;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_4e8,(string *)local_4a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._0_8_ != &local_498) {
    operator_delete((void *)local_4a8._0_8_,local_498._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_4c8,(string *)local_4a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._0_8_ != &local_498) {
    operator_delete((void *)local_4a8._0_8_,local_498._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
  std::ios_base::~ios_base(local_2b8);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar23 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  gl = (Functions *)CONCAT44(extraout_var,iVar23);
  iVar23 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  traits = glu::objectTraits(OBJECTTYPE_BUFFER);
  sVar21 = __n;
  glu::ObjectVector::ObjectVector
            ((ObjectVector *)local_4a8,(Functions *)CONCAT44(extraout_var_00,iVar23),traits,__n);
  iVar23 = (int)sVar21;
  GVar10 = 0x8a11;
  if (this->m_blockType == BLOCKTYPE_BUFFER) {
    GVar10 = 0x90d2;
  }
  pSVar13 = deqp::gls::ShaderExecUtil::createExecutor
                      (renderCtx,this->m_shaderType,(ShaderSpec *)local_520);
  local_328._0_8_ = (_func_int **)0x0;
  local_328._8_8_ = (pointer)0x0;
  local_318 = (pointer)0x0;
  local_198 = 0;
  local_1a8 = (undefined1  [8])0x0;
  pp_Stack_1a0 = (_func_int **)0x0;
  local_598.field_2._M_allocated_capacity = 0;
  local_598._M_dataplus._M_p = (pointer)0x0;
  local_598._M_string_length = 0;
  (*pSVar13->_vptr_ShaderExecutor[3])
            (pSVar13,((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  iVar9 = (*pSVar13->_vptr_ShaderExecutor[2])(pSVar13);
  if ((char)iVar9 == '\0') {
    this_02 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_02,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fOpaqueTypeIndexingTests.cpp"
               ,0x36a);
    __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar13->_vptr_ShaderExecutor[5])(pSVar13);
  if (0 < (int)uVar1) {
    GVar19 = 2;
    lVar20 = 0;
    do {
      (*gl->bindBuffer)(GVar10,*(GLuint *)(local_498._M_allocated_capacity + lVar20));
      iVar23 = 0x88e4;
      (*gl->bufferData)(GVar10,4,(void *)((long)local_548.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_start + lVar20),
                        0x88e4);
      (*gl->bindBufferBase)(GVar10,GVar19,*(GLuint *)(local_498._M_allocated_capacity + lVar20));
      GVar19 = GVar19 + 1;
      lVar20 = lVar20 + 4;
    } while (__n << 2 != lVar20);
  }
  if (this->m_indexExprType == INDEX_EXPR_TYPE_UNIFORM) {
    dVar8 = (*pSVar13->_vptr_ShaderExecutor[4])(pSVar13);
    uploadUniformIndices(gl,dVar8,varPrefix,iVar23,indices);
  }
  else if (this->m_indexExprType == INDEX_EXPR_TYPE_DYNAMIC_UNIFORM) {
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)local_328,0x80);
    lVar20 = 0;
    pp_Var14 = (_func_int **)local_328._0_8_;
    do {
      uVar3 = *(undefined4 *)(varPrefix + lVar20 * 4);
      lVar18 = 0;
      do {
        *(undefined4 *)((long)pp_Var14 + lVar18) = uVar3;
        lVar18 = lVar18 + 4;
      } while (lVar18 != 0x80);
      lVar20 = lVar20 + 1;
      pp_Var14 = pp_Var14 + 0x10;
    } while (lVar20 != 4);
    lVar20 = 0;
    do {
      local_568._0_8_ = local_328._0_8_ + lVar20;
      std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                ((vector<void*,std::allocator<void*>> *)local_1a8,(void **)&local_568);
      lVar20 = lVar20 + 0x80;
    } while (lVar20 != 0x200);
  }
  lVar20 = 0;
  do {
    local_568._0_8_ = (long)local_570 + lVar20;
    std::vector<void*,std::allocator<void*>>::emplace_back<void*>
              ((vector<void*,std::allocator<void*>> *)&local_598,(void **)&local_568);
    lVar20 = lVar20 + 0x80;
  } while (lVar20 != 0x200);
  GVar10 = (*gl->getError)();
  glu::checkError(GVar10,"Setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fOpaqueTypeIndexingTests.cpp"
                  ,0x388);
  auVar16 = (undefined1  [8])(_func_int **)0x0;
  if (local_1a8 != (undefined1  [8])pp_Stack_1a0) {
    auVar16 = local_1a8;
  }
  (*pSVar13->_vptr_ShaderExecutor[6])(pSVar13,0x20,auVar16,local_598._M_dataplus._M_p);
  if (local_598._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_598._M_dataplus._M_p,
                    local_598.field_2._M_allocated_capacity - (long)local_598._M_dataplus._M_p);
  }
  if (local_1a8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1a8,local_198 - (long)local_1a8);
  }
  if ((_func_int **)local_328._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_328._0_8_,(long)local_318 - local_328._0_8_);
  }
  (*pSVar13->_vptr_ShaderExecutor[1])(pSVar13);
  glu::ObjectVector::~ObjectVector((ObjectVector *)local_4a8);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  this_00 = (ostringstream *)(local_4a8 + 8);
  lVar20 = 0;
  puVar24 = local_570;
  do {
    lVar18 = 0;
    puVar25 = puVar24;
    do {
      uVar1 = local_548.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[*(int *)(varPrefix + lVar18 * 4)];
      uVar7 = *puVar25;
      if (uVar1 != uVar7) {
        local_4a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"ERROR: at invocation ",0x15);
        std::ostream::operator<<(this_00,(int)lVar20);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", read ",7);
        std::ostream::operator<<(this_00,(int)lVar18);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,": expected ",0xb);
        local_328._0_8_ = (_func_int **)(ulong)uVar1;
        tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)local_328,(ostream *)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", got ",6);
        local_328._0_8_ = (_func_int **)(ulong)uVar7;
        tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)local_328,(ostream *)this_00);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_430);
        this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        if (this_01->m_testResult == QP_TEST_RESULT_PASS) {
          tcu::TestContext::setTestResult(this_01,QP_TEST_RESULT_FAIL,"Invalid result value");
        }
      }
      lVar18 = lVar18 + 1;
      puVar25 = puVar25 + 0x20;
    } while (lVar18 != 4);
    lVar20 = lVar20 + 1;
    puVar24 = puVar24 + 1;
  } while (lVar20 != 0x20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_p != &local_4b8) {
    operator_delete(local_4c8._M_p,
                    CONCAT71(local_4b8._M_allocated_capacity._1_7_,local_4b8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_p != &local_4d8) {
    operator_delete(local_4e8._M_p,
                    CONCAT71(local_4d8._M_allocated_capacity._1_7_,local_4d8._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_520 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_520 + 8));
  operator_delete(local_570,0x200);
  if (local_548.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_548.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_548.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_548.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  operator_delete(varPrefix,0x10);
  return STOP;
}

Assistant:

BlockArrayIndexingCase::IterateResult BlockArrayIndexingCase::iterate (void)
{
	const int			numInvocations		= 32;
	const int			numInstances		= m_numInstances;
	const int			numReads			= 4;
	vector<int>			readIndices			(numReads);
	vector<deUint32>	inValues			(numInstances);
	vector<deUint32>	outValues			(numInvocations*numReads);
	ShaderSpec			shaderSpec;
	de::Random			rnd					(deInt32Hash(m_shaderType) ^ deInt32Hash(m_blockType) ^ deInt32Hash(m_indexExprType));

	for (int readNdx = 0; readNdx < numReads; readNdx++)
		readIndices[readNdx] = rnd.getInt(0, numInstances-1);

	for (int instanceNdx = 0; instanceNdx < numInstances; instanceNdx++)
		inValues[instanceNdx] = rnd.getUint32();

	getShaderSpec(&shaderSpec, numInstances, numReads, &readIndices[0], m_context.getRenderContext());

	{
		const RenderContext&	renderCtx		= m_context.getRenderContext();
		const glw::Functions&	gl				= renderCtx.getFunctions();
		const int				baseBinding		= 2;
		const BufferVector		buffers			(renderCtx, numInstances);
		const deUint32			bufTarget		= m_blockType == BLOCKTYPE_BUFFER ? GL_SHADER_STORAGE_BUFFER : GL_UNIFORM_BUFFER;
		ShaderExecutorPtr		shaderExecutor	(createExecutor(renderCtx, m_shaderType, shaderSpec));
		vector<int>				expandedIndices;
		vector<void*>			inputs;
		vector<void*>			outputs;

		m_testCtx.getLog() << *shaderExecutor;

		if (!shaderExecutor->isOk())
			TCU_FAIL("Compile failed");

		shaderExecutor->useProgram();

		for (int instanceNdx = 0; instanceNdx < numInstances; instanceNdx++)
		{
			gl.bindBuffer(bufTarget, buffers[instanceNdx]);
			gl.bufferData(bufTarget, (glw::GLsizeiptr)sizeof(deUint32), &inValues[instanceNdx], GL_STATIC_DRAW);
			gl.bindBufferBase(bufTarget, baseBinding+instanceNdx, buffers[instanceNdx]);
		}

		if (m_indexExprType == INDEX_EXPR_TYPE_DYNAMIC_UNIFORM)
		{
			expandedIndices.resize(numInvocations * readIndices.size());

			for (int readNdx = 0; readNdx < numReads; readNdx++)
			{
				int* dst = &expandedIndices[numInvocations*readNdx];
				std::fill(dst, dst+numInvocations, readIndices[readNdx]);
			}

			for (int readNdx = 0; readNdx < numReads; readNdx++)
				inputs.push_back(&expandedIndices[readNdx*numInvocations]);
		}
		else if (m_indexExprType == INDEX_EXPR_TYPE_UNIFORM)
			uploadUniformIndices(gl, shaderExecutor->getProgram(), "index", numReads, &readIndices[0]);

		for (int readNdx = 0; readNdx < numReads; readNdx++)
			outputs.push_back(&outValues[readNdx*numInvocations]);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Setup failed");

		shaderExecutor->execute(numInvocations, inputs.empty() ? DE_NULL : &inputs[0], &outputs[0]);
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	for (int invocationNdx = 0; invocationNdx < numInvocations; invocationNdx++)
	{
		for (int readNdx = 0; readNdx < numReads; readNdx++)
		{
			const deUint32	refValue	= inValues[readIndices[readNdx]];
			const deUint32	resValue	= outValues[readNdx*numInvocations + invocationNdx];

			if (refValue != resValue)
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: at invocation " << invocationNdx
													   << ", read " << readNdx << ": expected "
													   << tcu::toHex(refValue) << ", got " << tcu::toHex(resValue)
								   << TestLog::EndMessage;

				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid result value");
			}
		}
	}

	return STOP;
}